

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTest.cpp
# Opt level: O3

void __thiscall TEST_SimpleString_StrCmp_Test::testBody(TEST_SimpleString_StrCmp_Test *this)

{
  int iVar1;
  UtestShell *pUVar2;
  TestTerminator *pTVar3;
  char empty [1];
  char bla [4];
  char blabla [7];
  
  empty[0] = '\0';
  builtin_strncpy(blabla,"blabla",7);
  builtin_strncpy(bla,"bla",4);
  pUVar2 = UtestShell::getCurrent();
  iVar1 = SimpleString::StrCmp(empty,empty);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)(iVar1 == 0),"CHECK","SimpleString::StrCmp(empty, empty) == 0",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x3af,pTVar3);
  pUVar2 = UtestShell::getCurrent();
  iVar1 = SimpleString::StrCmp(bla,blabla);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)(iVar1 == -0x62),"CHECK",
             "SimpleString::StrCmp(bla, blabla) == -(int)\'b\'",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x3b0,pTVar3);
  pUVar2 = UtestShell::getCurrent();
  iVar1 = SimpleString::StrCmp(blabla,bla);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)(iVar1 == 0x62),"CHECK","SimpleString::StrCmp(blabla, bla) == \'b\'",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x3b1,pTVar3);
  pUVar2 = UtestShell::getCurrent();
  iVar1 = SimpleString::StrCmp(bla,empty);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)(iVar1 == 0x62),"CHECK","SimpleString::StrCmp(bla, empty) == \'b\'",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x3b2,pTVar3);
  pUVar2 = UtestShell::getCurrent();
  iVar1 = SimpleString::StrCmp(empty,bla);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)(iVar1 == -0x62),"CHECK",
             "SimpleString::StrCmp(empty, bla) == -(int)\'b\'",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x3b3,pTVar3);
  pUVar2 = UtestShell::getCurrent();
  iVar1 = SimpleString::StrCmp(bla,bla);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)(iVar1 == 0),"CHECK","SimpleString::StrCmp(bla, bla) == 0",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x3b4,pTVar3);
  return;
}

Assistant:

TEST(SimpleString, StrCmp)
{
    char empty[] = "";
    char blabla[] = "blabla";
    char bla[] = "bla";
    CHECK(SimpleString::StrCmp(empty, empty) == 0);
    CHECK(SimpleString::StrCmp(bla, blabla) == -(int)'b');
    CHECK(SimpleString::StrCmp(blabla, bla) == 'b');
    CHECK(SimpleString::StrCmp(bla, empty) == 'b');
    CHECK(SimpleString::StrCmp(empty, bla) == -(int)'b');
    CHECK(SimpleString::StrCmp(bla, bla) == 0);
}